

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O3

int mp_init(mp_int *a)

{
  int iVar1;
  mp_digit *pmVar2;
  
  pmVar2 = (mp_digit *)calloc(1,0x100);
  a->dp = pmVar2;
  if (pmVar2 == (mp_digit *)0x0) {
    iVar1 = -2;
  }
  else {
    a->used = 0;
    a->alloc = 0x20;
    a->sign = 0;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int mp_init (mp_int * a)
{
  int i;

  /* allocate memory required and clear it */
  a->dp = OPT_CAST(mp_digit) XMALLOC (sizeof (mp_digit) * MP_PREC);
  if (a->dp == NULL) {
    return MP_MEM;
  }

  /* set the digits to zero */
  for (i = 0; i < MP_PREC; i++) {
      a->dp[i] = 0;
  }

  /* set the used to zero, allocated digits to the default precision
   * and sign to positive */
  a->used  = 0;
  a->alloc = MP_PREC;
  a->sign  = MP_ZPOS;

  return MP_OKAY;
}